

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
::clear(raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
        *this)

{
  long lVar1;
  size_t i;
  size_t sVar2;
  size_t sVar3;
  
  if (this->size_ == 0) {
    return;
  }
  sVar3 = this->capacity_;
  if (sVar3 != 0) {
    lVar1 = 0;
    for (sVar2 = 0; sVar2 != sVar3; sVar2 = sVar2 + 1) {
      if (-1 < this->ctrl_[sVar2]) {
        node_hash_policy<std::pair<int_const,int>&,phmap::priv::NodeHashMapPolicy<int,int>>::
        destroy<phmap::priv::Alloc<std::pair<int_const,int>>>
                  ((Alloc<std::pair<const_int,_int>_> *)&this->settings_,
                   (slot_type *)((long)this->slots_ + lVar1));
        sVar3 = this->capacity_;
      }
      lVar1 = lVar1 + 8;
    }
    this->size_ = 0;
    memset(this->ctrl_,0x80,sVar3 + 0x10);
    this->ctrl_[sVar3] = -1;
    reset_growth_left(this,this->capacity_);
    if (this->size_ == 0) {
      return;
    }
  }
  __assert_fail("empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x50a,
                "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<int, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const int, int>>>::clear() [Policy = phmap::priv::NodeHashMapPolicy<int, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const int, int>>]"
               );
}

Assistant:

bool empty() const { return !size(); }